

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall ot::commissioner::coap::Coap::HandleRequest(Coap *this,Request *aRequest)

{
  char cVar1;
  ErrorCode EVar2;
  Error *pEVar3;
  Response *aMessage;
  char *pcVar4;
  iterator iVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  allocator local_139;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  code *local_110;
  code *local_108;
  Error error;
  writer write;
  ulong uStack_d0;
  string local_b8;
  string local_98;
  string uriPath;
  undefined1 local_58 [40];
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  uriPath._M_dataplus._M_p = (pointer)&uriPath.field_2;
  uriPath._M_string_length = 0;
  uriPath.field_2._M_local_buf[0] = '\0';
  Message::GetUriPath((Error *)local_138,aRequest,&uriPath);
  pEVar3 = Error::operator=(&error,(Error *)local_138);
  EVar2 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)&local_130);
  if (EVar2 == kNone) {
    aMessage = ResponsesCache::Match(&this->mResponsesCache,aRequest);
    if (aMessage == (Response *)0x0) {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
              ::find(&(this->mResources)._M_t,&uriPath);
      if ((_Rb_tree_header *)iVar5._M_node == &(this->mResources)._M_t._M_impl.super__Rb_tree_header
         ) {
        if ((this->mDefaultHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
          SendNotFound((Error *)local_58,this,aRequest);
          std::__cxx11::string::~string((string *)(local_58 + 8));
        }
        else {
          std::function<void_(const_ot::commissioner::coap::Message_&)>::operator()
                    (&this->mDefaultHandler,aRequest);
        }
      }
      else {
        Resource::HandleRequest((Resource *)(iVar5._M_node + 2),aRequest);
      }
      local_138 = (undefined1  [8])((ulong)(uint)local_138._4_4_ << 0x20);
      local_130._M_p = (pointer)&aStack_120;
      local_128 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x0;
      aStack_120._M_allocated_capacity = aStack_120._M_allocated_capacity & 0xffffffffffffff00;
      Error::operator=(&error,(Error *)local_138);
      std::__cxx11::string::~string((string *)&local_130);
    }
    else {
      std::__cxx11::string::string((string *)&local_98,"coap",&local_139);
      local_138._0_4_ = pointer_type;
      local_138._4_4_ = string_type;
      local_130._M_p = "server(={}) found cached CoAP response for resource {}";
      local_128 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x36;
      aStack_120._M_allocated_capacity = 0x200000000;
      local_110 = ::fmt::v10::detail::
                  parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      local_108 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar4 = "server(={}) found cached CoAP response for resource {}";
      aStack_120._8_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_138;
      write.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_138;
      while (pcVar4 != "") {
        cVar1 = *pcVar4;
        pcVar6 = pcVar4;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&write,pcVar4,"");
            goto LAB_001a05c2;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&write,pcVar4,pcVar6);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_138);
      }
LAB_001a05c2:
      local_128 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)uriPath._M_dataplus._M_p;
      aStack_120._M_allocated_capacity = uriPath._M_string_length;
      fmt.size_ = 0xde;
      fmt.data_ = (char *)0x36;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_138;
      local_138 = (undefined1  [8])this;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"server(={}) found cached CoAP response for resource {}",fmt,args)
      ;
      Log(kInfo,&local_98,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      Send((Error *)local_138,this,aMessage);
      Error::operator=(&error,(Error *)local_138);
      std::__cxx11::string::~string((string *)&local_130);
    }
  }
  if (error.mCode != kNone) {
    std::__cxx11::string::string((string *)&local_98,"coap",&local_139);
    local_138._0_4_ = pointer_type;
    local_138._4_4_ = string_type;
    local_130._M_p = "server(={}) handle request failed: {}";
    local_128 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x25;
    aStack_120._M_allocated_capacity = 0x200000000;
    local_110 = ::fmt::v10::detail::
                parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    local_108 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar4 = "server(={}) handle request failed: {}";
    aStack_120._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_138;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_138;
    while (pcVar4 != "") {
      cVar1 = *pcVar4;
      pcVar6 = pcVar4;
      while (cVar1 != '{') {
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar4,"");
          goto LAB_001a07d4;
        }
        cVar1 = *pcVar6;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,pcVar4,pcVar6);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string>&>
                         (pcVar6,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_138);
    }
LAB_001a07d4:
    Error::ToString_abi_cxx11_((string *)&write,&error);
    local_128 = write.handler_;
    aStack_120._M_allocated_capacity = uStack_d0;
    fmt_00.size_ = 0xde;
    fmt_00.data_ = (char *)0x25;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_138;
    local_138 = (undefined1  [8])this;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"server(={}) handle request failed: {}",fmt_00,args_00);
    Log(kInfo,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&write);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)&uriPath);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void Coap::HandleRequest(const Request &aRequest)
{
    Error                                error;
    const Response                      *response = nullptr;
    std::string                          uriPath;
    decltype(mResources)::const_iterator resource;

    SuccessOrExit(error = aRequest.GetUriPath(uriPath));

    response = mResponsesCache.Match(aRequest);
    if (response != nullptr)
    {
        LOG_INFO(LOG_REGION_COAP, "server(={}) found cached CoAP response for resource {}", static_cast<void *>(this),
                 uriPath);
        ExitNow(error = Send(*response));
    }

    resource = mResources.find(uriPath);
    if (resource != mResources.end())
    {
        resource->second.HandleRequest(aRequest);
        ExitNow(error = ERROR_NONE);
    }
    else if (mDefaultHandler != nullptr)
    {
        mDefaultHandler(aRequest);
        ExitNow(error = ERROR_NONE);
    }
    else
    {
        IgnoreError(SendNotFound(aRequest));
        ExitNow(error = ERROR_NONE);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_INFO(LOG_REGION_COAP, "server(={}) handle request failed: {}", static_cast<void *>(this), error.ToString());
    }
}